

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bms_note.cpp
# Opt level: O2

void __thiscall BmsNoteManager::DP_TO_SP(BmsNoteManager *this)

{
  _Rb_tree_node_base *p_Var1;
  int c;
  long lVar2;
  
  for (lVar2 = 10; lVar2 != 0x14; lVar2 = lVar2 + 1) {
    for (p_Var1 = *(_Rb_tree_node_base **)&this->lanes_[lVar2].field_0x18;
        p_Var1 != (_Rb_tree_node_base *)&this->lanes_[lVar2].field_0x8;
        p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
      BmsNoteLane::Set((BmsNoteLane *)((long)this + lVar2 * 0x30 + -0x1e0),p_Var1[1]._M_color,
                       (BmsNote *)&p_Var1[1]._M_parent);
    }
    std::
    _Rb_tree<int,_std::pair<const_int,_BmsNote>,_std::_Select1st<std::pair<const_int,_BmsNote>_>,_std::less<int>,_std::allocator<std::pair<const_int,_BmsNote>_>_>
    ::clear((_Rb_tree<int,_std::pair<const_int,_BmsNote>,_std::_Select1st<std::pair<const_int,_BmsNote>_>,_std::less<int>,_std::allocator<std::pair<const_int,_BmsNote>_>_>
             *)(this->lanes_ + lVar2));
  }
  FixIncorrectLongNote(this);
  return;
}

Assistant:

void BmsNoteManager::DP_TO_SP() {
	// just merge note at first
	for (int c = 10; c < 20; c++) {
		for (auto it = lanes_[c].Begin(); it != lanes_[c].End(); ++it) {
			lanes_[c - 10].Set(it->first, it->second);
		}
		lanes_[c].Clear();
	}

	// after merge, check LN validation.
	FixIncorrectLongNote();
}